

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O0

void __thiscall CDirectiveData::CDirectiveData(CDirectiveData *this)

{
  Endianness EVar1;
  Architecture *pAVar2;
  CDirectiveData *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveData_002b2c30;
  this->position = 0;
  std::vector<Expression,_std::allocator<Expression>_>::vector(&this->entries);
  ByteArray::ByteArray(&this->customData);
  std::vector<long,_std::allocator<long>_>::vector(&this->normalData);
  this->mode = Invalid;
  this->writeTermination = false;
  pAVar2 = Architecture::current();
  EVar1 = (*pAVar2->_vptr_Architecture[7])();
  this->endianness = EVar1;
  return;
}

Assistant:

CDirectiveData::CDirectiveData()
{
	mode = EncodingMode::Invalid;
	writeTermination = false;
	endianness = Architecture::current().getEndianness();
}